

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall
el::LogBuilder::convertToColoredOutput(LogBuilder *this,string_t *logLine,Level level)

{
  long *plVar1;
  long *plVar2;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (base::utils::s_termSupportsColor != '\x01') {
    return;
  }
  if (level != Fatal) {
    if (level == Warning) {
      std::operator+(&local_38,"\x1b[33m",logLine);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_38);
      goto LAB_0011e290;
    }
    if (level != Error) {
      return;
    }
  }
  std::operator+(&local_38,"\x1b[31m",logLine);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_38);
LAB_0011e290:
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_48 = *plVar2;
    lStack_40 = plVar1[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar2;
    local_58 = (long *)*plVar1;
  }
  local_50 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)logLine,(string *)&local_58);
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void convertToColoredOutput(base::type::string_t* logLine, Level level) {
        if (!base::utils::s_termSupportsColor) return;
        const base::type::char_t* resetColor = ELPP_LITERAL("\x1b[0m");
        if (level == Level::Error || level == Level::Fatal)
            *logLine = ELPP_LITERAL("\x1b[31m") + *logLine + resetColor;
        else if (level == Level::Warning)
            *logLine = ELPP_LITERAL("\x1b[33m") + *logLine + resetColor;
    }